

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

uint mg_init_library(uint features)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  char *__src;
  bool bVar10;
  
  if ((mg_init_library_called < 1) &&
     (iVar3 = pthread_mutex_init((pthread_mutex_t *)&global_lock_mutex,(pthread_mutexattr_t *)0x0),
     iVar3 != 0)) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&global_lock_mutex);
  if (mg_init_library_called < 1) {
    iVar3 = pthread_key_create(&sTlsKey,tls_dtor);
    if ((iVar3 == 0) &&
       (iVar4 = pthread_mutexattr_init((pthread_mutexattr_t *)&pthread_mutex_attr), iVar4 == 0)) {
      iVar4 = pthread_mutexattr_settype((pthread_mutexattr_t *)&pthread_mutex_attr,1);
      bVar10 = iVar4 == 0;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar10 = false;
    }
    if (bVar10) {
      sVar8 = 1;
      pcVar7 = "GET";
      lVar9 = 0;
      do {
        sVar5 = strlen(pcVar7);
        sVar1 = sVar5 + 2;
        if (lVar9 == 0) {
          sVar1 = sVar5;
        }
        sVar8 = sVar1 + sVar8;
        pcVar7 = *(char **)((long)&http_methods[1].name + lVar9);
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x200);
      pcVar7 = (char *)malloc(sVar8);
      all_methods = pcVar7;
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
        __src = "GET";
        lVar9 = 0;
        do {
          if (lVar9 == 0) {
            strcpy(pcVar7,__src);
          }
          else {
            sVar8 = strlen(pcVar7);
            (pcVar7 + sVar8)[0] = ',';
            (pcVar7 + sVar8)[1] = ' ';
            pcVar7[sVar8 + 2] = '\0';
            strcat(pcVar7,__src);
          }
          __src = *(char **)((long)&http_methods[1].name + lVar9);
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0x200);
        goto LAB_001182f3;
      }
    }
    else {
      if (bVar2) {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)&pthread_mutex_attr);
      }
      if (iVar3 == 0) {
        pthread_key_delete(sTlsKey);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&global_lock_mutex);
    pthread_mutex_destroy((pthread_mutex_t *)&global_lock_mutex);
    uVar6 = 0;
  }
  else {
LAB_001182f3:
    uVar6 = features & 8;
    iVar3 = mg_init_library_called + 1;
    bVar10 = 0 < mg_init_library_called;
    mg_init_library_called = 1;
    if (bVar10) {
      mg_init_library_called = iVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&global_lock_mutex);
  }
  return uVar6;
}

Assistant:

CIVETWEB_API unsigned
mg_init_library(unsigned features)
{
	unsigned features_to_init = mg_check_feature(features & 0xFFu);
	unsigned features_inited = features_to_init;

	if (mg_init_library_called <= 0) {
		/* Not initialized yet */
		if (0 != pthread_mutex_init(&global_lock_mutex, NULL)) {
			return 0;
		}
	}

	mg_global_lock();

	if (mg_init_library_called <= 0) {
		int i;
		size_t len;

#if defined(_WIN32)
		int file_mutex_init = 1;
		int wsa = 1;
#else
		int mutexattr_init = 1;
#endif
		int failed = 1;
		int key_create = pthread_key_create(&sTlsKey, tls_dtor);

		if (key_create == 0) {
#if defined(_WIN32)
			file_mutex_init =
			    pthread_mutex_init(&global_log_file_lock, &pthread_mutex_attr);
			if (file_mutex_init == 0) {
				/* Start WinSock */
				WSADATA data;
				failed = wsa = WSAStartup(MAKEWORD(2, 2), &data);
			}
#else
			mutexattr_init = pthread_mutexattr_init(&pthread_mutex_attr);
			if (mutexattr_init == 0) {
				failed = pthread_mutexattr_settype(&pthread_mutex_attr,
				                                   PTHREAD_MUTEX_RECURSIVE);
			}
#endif
		}

		if (failed) {
#if defined(_WIN32)
			if (wsa == 0) {
				(void)WSACleanup();
			}
			if (file_mutex_init == 0) {
				(void)pthread_mutex_destroy(&global_log_file_lock);
			}
#else
			if (mutexattr_init == 0) {
				(void)pthread_mutexattr_destroy(&pthread_mutex_attr);
			}
#endif
			if (key_create == 0) {
				(void)pthread_key_delete(sTlsKey);
			}
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}

		len = 1;
		for (i = 0; http_methods[i].name != NULL; i++) {
			size_t sl = strlen(http_methods[i].name);
			len += sl;
			if (i > 0) {
				len += 2;
			}
		}
		all_methods = (char *)mg_malloc(len);
		if (!all_methods) {
			/* Must never happen */
			mg_global_unlock();
			(void)pthread_mutex_destroy(&global_lock_mutex);
			return 0;
		}
		all_methods[0] = 0;
		for (i = 0; http_methods[i].name != NULL; i++) {
			if (i > 0) {
				strcat(all_methods, ", ");
				strcat(all_methods, http_methods[i].name);
			} else {
				strcpy(all_methods, http_methods[i].name);
			}
		}
	}

#if defined(USE_LUA)
	lua_init_optional_libraries();
#endif

#if (defined(OPENSSL_API_1_0) || defined(OPENSSL_API_1_1)                      \
     || defined(OPENSSL_API_3_0))                                              \
    && !defined(NO_SSL)

	if (features_to_init & MG_FEATURES_SSL) {
		if (!mg_openssl_initialized) {
			char ebuf[128];
			if (initialize_openssl(ebuf, sizeof(ebuf))) {
				mg_openssl_initialized = 1;
			} else {
				(void)ebuf;
				DEBUG_TRACE("Initializing SSL failed: %s", ebuf);
				features_inited &= ~((unsigned)(MG_FEATURES_SSL));
			}
		} else {
			/* ssl already initialized */
		}
	}

#endif

	if (mg_init_library_called <= 0) {
		mg_init_library_called = 1;
	} else {
		mg_init_library_called++;
	}
	mg_global_unlock();

	return features_inited;
}